

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ComponentManifestHash32TableItem * __thiscall
ON_ComponentIdHash32Table::AddManifestItem
          (ON_ComponentIdHash32Table *this,ON_ComponentManifestItem_PRIVATE *manifest_item)

{
  bool bVar1;
  ON__UINT32 hash32_00;
  ON_ComponentManifestHash32TableItem *hash_table_item;
  undefined1 auStack_30 [4];
  ON__UINT32 hash32;
  ON_UUID id;
  ON_ComponentManifestItem_PRIVATE *manifest_item_local;
  ON_ComponentIdHash32Table *this_local;
  
  id.Data4 = (uchar  [8])manifest_item;
  _auStack_30 = IdFromManifestItem(&manifest_item->super_ON_ComponentManifestItem);
  bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)auStack_30);
  if (bVar1) {
    this_local = (ON_ComponentIdHash32Table *)0x0;
  }
  else {
    hash32_00 = IdHash32((ON_UUID *)auStack_30);
    this_local = (ON_ComponentIdHash32Table *)
                 ON_ManifestHash32TableItemFixedSizePool::AllocateHashTableItem
                           (this->m_fsp,(ON_ComponentManifestItem_PRIVATE *)id.Data4);
    bVar1 = ON_Hash32Table::AddItem
                      (&this->super_ON_Hash32Table,hash32_00,(ON_Hash32TableItem *)this_local);
    if (!bVar1) {
      ON_ManifestHash32TableItemFixedSizePool::ReturnHashTableItem
                (this->m_fsp,(ON_ComponentManifestHash32TableItem *)this_local);
      this_local = (ON_ComponentIdHash32Table *)0x0;
    }
  }
  return (ON_ComponentManifestHash32TableItem *)this_local;
}

Assistant:

const ON_ComponentManifestHash32TableItem* AddManifestItem(
    const class ON_ComponentManifestItem_PRIVATE* manifest_item
    )
  {
    const ON_UUID id = IdFromManifestItem(manifest_item);
    if ( ON_nil_uuid == id )
      return nullptr;
    const ON__UINT32 hash32 = ON_ComponentIdHash32Table::IdHash32(id);
    
    ON_ComponentManifestHash32TableItem* hash_table_item = m_fsp.AllocateHashTableItem(manifest_item);
    if ( AddItem( hash32, hash_table_item ) )
      return hash_table_item;

    m_fsp.ReturnHashTableItem(hash_table_item);
    return nullptr;
  }